

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.h
# Opt level: O0

void __thiscall Jinx::Impl::Lexer::Error<>(Lexer *this,char *format)

{
  bool bVar1;
  char *pcVar2;
  char *format_local;
  Lexer *this_local;
  
  if ((this->m_error & 1U) == 0) {
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::empty
                      (&this->m_name);
    if (bVar1) {
      LogWrite(Error,"Error at line %i, column %i:",(ulong)this->m_lineNumber,
               (ulong)this->m_columnNumber);
    }
    else {
      pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
               c_str(&this->m_name);
      LogWrite(Error,"Error in \'%s\' at line %i, column %i: ",pcVar2,(ulong)this->m_lineNumber,
               (ulong)this->m_columnNumber);
    }
    LogWriteLine(Error,format);
    ErrorWriteDetails(this);
    this->m_error = true;
  }
  return;
}

Assistant:

void Error(const char * format, Args&&... args)
		{
			if (m_error)
				return;
			if (m_name.empty())
				LogWrite(LogLevel::Error, "Error at line %i, column %i:", m_lineNumber, m_columnNumber);
			else
				LogWrite(LogLevel::Error, "Error in '%s' at line %i, column %i: ", m_name.c_str(), m_lineNumber, m_columnNumber);
			LogWriteLine(LogLevel::Error, format, std::forward<Args>(args)...);
			ErrorWriteDetails();
			m_error = true;
		}